

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *this;
  element_type *peVar2;
  element_type *peVar3;
  EVP_PKEY_CTX *ctx;
  char *err;
  BoolFunctor local_248;
  anon_class_8_1_50cfef72 local_228;
  ConnCallback local_220;
  shared_ptr<Liby::Channel> local_200;
  undefined4 local_1ec;
  shared_ptr<Liby::FileDescriptor> local_1e8;
  shared_ptr<Liby::FileDescriptor> local_1d8;
  undefined1 local_1c8 [8];
  shared_ptr<Liby::Connection> input_conn;
  Poller *local_1b0;
  undefined1 local_1a8 [8];
  shared_ptr<Liby::Channel> input_chan;
  UdpConnCallback local_190;
  anon_class_8_1_50cfef72 local_170;
  UdpConnCallback local_168;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118;
  undefined1 local_f8 [8];
  shared_ptr<Liby::UdpSocket> udp_client;
  UdpConnection *p_uconn;
  allocator local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  EventLoopGroup group;
  char **argv_local;
  int argc_local;
  
  group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  if (argc == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"EPOLL",&local_c9);
    Liby::EventLoopGroup::EventLoopGroup((EventLoopGroup *)local_a8,0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    udp_client.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcVar1 = (char *)group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage[1]._M_id._M_thread;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,pcVar1,&local_119);
    pcVar1 = (char *)group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage[2]._M_id._M_thread;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,pcVar1,&local_141);
    Liby::EventLoopGroup::creatUdpClient((EventLoopGroup *)local_f8,(string *)local_a8,&local_118);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    peVar2 = std::__shared_ptr_access<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_f8);
    local_170.p_uconn =
         (UdpConnection **)
         &udp_client.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::function<void(Liby::UdpConnection&)>::function<main::__0,void>
              ((function<void(Liby::UdpConnection&)> *)&local_168,&local_170);
    Liby::UdpSocket::onConnect(peVar2,&local_168);
    std::function<void_(Liby::UdpConnection_&)>::~function(&local_168);
    peVar2 = std::__shared_ptr_access<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_f8);
    std::function<void(Liby::UdpConnection&)>::function<main::__1,void>
              ((function<void(Liby::UdpConnection&)> *)&local_190,
               (anon_class_1_0_00000001 *)
               ((long)&input_chan.super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    Liby::UdpSocket::onRead(peVar2,&local_190);
    std::function<void_(Liby::UdpConnection_&)>::~function(&local_190);
    local_1b0 = Liby::Poller::curr_thread_poller();
    input_conn.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 0;
    std::make_shared<Liby::Channel,Liby::Poller*,int>((Poller **)local_1a8,(int *)&local_1b0);
    local_1ec = 0;
    std::make_shared<Liby::FileDescriptor,int>((int *)&local_1e8);
    std::make_shared<Liby::Socket,std::shared_ptr<Liby::FileDescriptor>>(&local_1d8);
    std::make_shared<Liby::Connection,std::shared_ptr<Liby::Socket>>
              ((shared_ptr<Liby::Socket> *)local_1c8);
    std::shared_ptr<Liby::Socket>::~shared_ptr((shared_ptr<Liby::Socket> *)&local_1d8);
    std::shared_ptr<Liby::FileDescriptor>::~shared_ptr(&local_1e8);
    peVar3 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1c8);
    ctx = (EVP_PKEY_CTX *)&local_200;
    std::shared_ptr<Liby::Channel>::shared_ptr
              ((shared_ptr<Liby::Channel> *)ctx,(shared_ptr<Liby::Channel> *)local_1a8);
    Liby::Connection::setChannel(peVar3,(ChanPtr *)ctx);
    std::shared_ptr<Liby::Channel>::~shared_ptr(&local_200);
    peVar3 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1c8);
    Liby::Connection::init(peVar3,ctx);
    peVar3 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1c8);
    Liby::Connection::init1(peVar3);
    peVar3 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1c8);
    local_228.p_uconn =
         (UdpConnection **)
         &udp_client.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::function<void(Liby::Connection&)>::function<main::__2,void>
              ((function<void(Liby::Connection&)> *)&local_220,&local_228);
    Liby::Connection::onRead(peVar3,&local_220);
    std::function<void_(Liby::Connection_&)>::~function(&local_220);
    std::function<bool()>::
    function<Liby::EventLoopGroup::run(std::function<bool()>)::_default_arg_1_::_lambda()_1_,void>
              ((function<bool()> *)&local_248,(anon_class_1_0_00000001 *)((long)&err + 7));
    Liby::EventLoopGroup::run((EventLoopGroup *)local_a8,&local_248);
    std::function<bool_()>::~function(&local_248);
    std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)local_1c8);
    std::shared_ptr<Liby::Channel>::~shared_ptr((shared_ptr<Liby::Channel> *)local_1a8);
    std::shared_ptr<Liby::UdpSocket>::~shared_ptr((shared_ptr<Liby::UdpSocket> *)local_f8);
    Liby::EventLoopGroup::~EventLoopGroup((EventLoopGroup *)local_a8);
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"usage: ./udp_client host service");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  argv_local._4_4_ = (uint)(argc != 3);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 3) {
        cerr << "usage: ./udp_client host service" << endl;
        return 1;
    }

    try {
        EventLoopGroup group;
        UdpConnection *p_uconn = nullptr;
        auto udp_client = group.creatUdpClient(argv[1], argv[2]);
        udp_client->onConnect([&](UdpConnection &uconn) {
            p_uconn = &uconn;
            //            uconn.send(" ");
        });
        udp_client->onRead([&](UdpConnection &uconn) {
            cout << uconn.read().retriveveAllAsString() << endl;
        });
        auto input_chan =
            std::make_shared<Channel>(Poller::curr_thread_poller(), 0);
        auto input_conn = std::make_shared<Connection>(
            std::make_shared<Socket>(std::make_shared<FileDescriptor>(0)));
        input_conn->setChannel(input_chan);
        input_conn->init();
        input_conn->init1();
        input_conn->onRead([&](Connection &in) {
            if (p_uconn == nullptr)
                return;
            auto str = in.read().retriveveAllAsString();
            //            cout << "input " << str << endl;
            p_uconn->send(str, [str] {
                //                cout << "try to send " << str << endl;
            });
        });
        group.run();
    } catch (const char *err) { cerr << err << endl; }
}